

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_set.c
# Opt level: O0

int mpt_string_pset(char **ptr,mpt_convertable *src)

{
  int iVar1;
  size_t sVar2;
  int local_40;
  char *pcStack_30;
  int len;
  iovec vec;
  mpt_convertable *src_local;
  char **ptr_local;
  
  vec.iov_len = (size_t)src;
  if (src == (mpt_convertable *)0x0) {
    if ((ptr == (char **)0x0) || (*ptr == (char *)0x0)) {
      local_40 = 0;
    }
    else {
      sVar2 = strlen(*ptr);
      local_40 = (int)sVar2;
    }
    ptr_local._4_4_ = local_40;
  }
  else {
    iVar1 = (*src->_vptr->convert)(src,0x43,&stack0xffffffffffffffd0);
    if (iVar1 < 1) {
      pcStack_30 = (char *)0x0;
      ptr_local._4_4_ =
           (*(code *)**(undefined8 **)vec.iov_len)(vec.iov_len,0x73,&stack0xffffffffffffffd0);
      if (-1 < ptr_local._4_4_) {
        if ((ptr_local._4_4_ == 0) || (pcStack_30 == (char *)0x0)) {
          mpt_string_set(ptr,(char *)0x0,0);
        }
        else {
          iVar1 = mpt_string_set(ptr,pcStack_30,-1);
          if (iVar1 < 0) {
            return (uint)(iVar1 < 0);
          }
        }
        ptr_local._4_4_ = 0;
      }
    }
    else {
      ptr_local._4_4_ = mpt_string_set(ptr,pcStack_30,(int)vec.iov_base);
      if (-1 < ptr_local._4_4_) {
        ptr_local._4_4_ = 0;
      }
    }
  }
  return ptr_local._4_4_;
}

Assistant:

extern int mpt_string_pset(char **ptr, MPT_INTERFACE(convertable) *src)
{
	struct iovec vec;
	int len;
	
	if (!src) {
		return (ptr && *ptr) ? strlen(*ptr) : 0;
	}
	if ((len = src->_vptr->convert(src, MPT_type_toVector('c'), &vec)) > 0) {
		if ((len = mpt_string_set(ptr, vec.iov_base, vec.iov_len)) < 0) {
			return len;
		}
		return 0;
	}
	vec.iov_base = 0;
	if ((len = src->_vptr->convert(src, 's', &vec.iov_base)) < 0) {
		return len;
	}
	if (!len || !vec.iov_base) {
		mpt_string_set(ptr, 0, 0);
	}
	else if ((len = mpt_string_set(ptr, vec.iov_base, -1) < 0)) {
		return len;
	}
	return 0;
}